

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memsave.cpp
# Opt level: O1

int save_raw(char *file_name,char *buf,unsigned_long len)

{
  FILE *__s;
  size_t sVar1;
  
  __s = fopen(file_name,"wb");
  if (__s == (FILE *)0x0) {
    printf("Failed to open: %s\n",file_name);
  }
  else {
    sVar1 = fwrite(buf,1,len,__s);
    if (-1 < (int)sVar1) {
      fclose(__s);
      return 0;
    }
    puts("Failed to write file");
    fclose(__s);
  }
  return -1;
}

Assistant:

int save_raw(char *file_name, char *buf, unsigned long len)
{
	int ret;
	FILE *fp = fopen(file_name, "wb");
	if (fp == NULL) {
		printf("Failed to open: %s\n", file_name);
		return -1;
	}
	
	ret = fwrite(buf, 1, len, fp);
	if (ret < 0) {
		printf("Failed to write file\n");
		fclose(fp);
		return -1;
	}
	
	fclose(fp);
	return 0;	
}